

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O1

int pcre2_substring_length_bynumber_16
              (pcre2_match_data_16 *match_data,uint32_t stringnumber,size_t *sizeptr)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = match_data->rc;
  if (iVar2 == -2) {
    if (stringnumber != 0) {
      return -2;
    }
    iVar2 = 0;
  }
  else if (iVar2 < 0) {
    return iVar2;
  }
  if (match_data->matchedby == 1) {
    iVar1 = -0x36;
    if ((stringnumber < match_data->oveccount) && (iVar1 = -0x37, stringnumber <= iVar2 - 1U)) {
LAB_001628b7:
      if (sizeptr != (size_t *)0x0) {
        sVar3 = 0;
        if (match_data->ovector[stringnumber * 2] <=
            match_data->ovector[(ulong)(stringnumber * 2) + 1]) {
          sVar3 = match_data->ovector[(ulong)(stringnumber * 2) + 1] -
                  match_data->ovector[stringnumber * 2];
        }
        *sizeptr = sVar3;
        return 0;
      }
      return 0;
    }
  }
  else {
    iVar1 = -0x31;
    if ((stringnumber <= match_data->code->top_bracket) &&
       (iVar1 = -0x36, stringnumber < match_data->oveccount)) {
      if (match_data->ovector[stringnumber * 2] == 0xffffffffffffffff) {
        return -0x37;
      }
      goto LAB_001628b7;
    }
  }
  return iVar1;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_length_bynumber(pcre2_match_data *match_data,
  uint32_t stringnumber, PCRE2_SIZE *sizeptr)
{
PCRE2_SIZE left, right;
int count = match_data->rc;
if (count == PCRE2_ERROR_PARTIAL)
  {
  if (stringnumber > 0) return PCRE2_ERROR_PARTIAL;
  count = 0;
  }
else if (count < 0) return count;            /* Match failed */

if (match_data->matchedby != PCRE2_MATCHEDBY_DFA_INTERPRETER)
  {
  if (stringnumber > match_data->code->top_bracket)
    return PCRE2_ERROR_NOSUBSTRING;
  if (stringnumber >= match_data->oveccount)
    return PCRE2_ERROR_UNAVAILABLE;
  if (match_data->ovector[stringnumber*2] == PCRE2_UNSET)
    return PCRE2_ERROR_UNSET;
  }
else  /* Matched using pcre2_dfa_match() */
  {
  if (stringnumber >= match_data->oveccount) return PCRE2_ERROR_UNAVAILABLE;
  if (count != 0 && stringnumber >= (uint32_t)count) return PCRE2_ERROR_UNSET;
  }

left = match_data->ovector[stringnumber*2];
right = match_data->ovector[stringnumber*2+1];
if (sizeptr != NULL) *sizeptr = (left > right)? 0 : right - left;
return 0;
}